

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

bool __thiscall
ArgsManager::WriteSettingsFile
          (ArgsManager *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors,bool backup)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_01;
  path src;
  path dest;
  bool bVar1;
  logic_error *this_00;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  write_errors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  path path_tmp;
  path path;
  undefined1 in_stack_fffffffffffffe68 [16];
  pointer in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe80 [16];
  pointer in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe98 [16];
  pointer pbVar3;
  _List _Var4;
  unique_lock<std::recursive_mutex> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108 [2];
  long local_f8 [2];
  string local_e8;
  path local_c8;
  path local_a0;
  path local_78;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_50);
  std::filesystem::__cxx11::path::path(&local_78);
  bVar1 = GetSettingsPath(this,(path *)&local_50,false,backup);
  if (bVar1) {
    bVar1 = GetSettingsPath(this,(path *)&local_78,true,backup);
    if (bVar1) {
      local_138._M_owns = false;
      local_138._M_device = (mutex_type *)this;
      std::unique_lock<std::recursive_mutex>::lock(&local_138);
      pbVar3 = (pointer)0x0;
      _Var4._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
              )0x0;
      bVar1 = common::WriteSettings
                        ((path *)&local_78,&(this->m_settings).rw_settings,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xfffffffffffffea8);
      if (bVar1) {
        std::filesystem::__cxx11::path::path(&local_a0,&local_78);
        std::filesystem::__cxx11::path::path(&local_c8,&local_50);
        src.super_path._M_pathname.field_2._M_allocated_capacity =
             (size_type)in_stack_fffffffffffffe78;
        src.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68._0_8_;
        src.super_path._M_pathname._M_string_length = in_stack_fffffffffffffe68._8_8_;
        src.super_path._24_16_ = in_stack_fffffffffffffe80;
        dest.super_path._M_pathname._8_16_ = in_stack_fffffffffffffe98;
        dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe90;
        dest.super_path._M_pathname.field_2._8_8_ = pbVar3;
        dest.super_path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             _Var4._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl;
        bVar1 = RenameOver(src,dest);
        std::filesystem::__cxx11::path::~path(&local_c8);
        std::filesystem::__cxx11::path::~path(&local_a0);
        bVar2 = true;
        if (!bVar1) {
          local_108[0] = local_f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,local_78._M_pathname._M_dataplus._M_p,
                     local_78._M_pathname._M_dataplus._M_p + local_78._M_pathname._M_string_length);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,local_50._M_pathname._M_dataplus._M_p,
                     local_50._M_pathname._M_dataplus._M_p + local_50._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_e8,(tinyformat *)"Failed renaming settings file %s to %s\n",
                     (char *)local_108,&local_128,in_R8);
          __l._M_len = 1;
          __l._M_array = &local_e8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffe78,__l,(allocator_type *)&stack0xfffffffffffffe77);
          errors_00.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe78;
          errors_00.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68._0_8_;
          errors_00.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe68._8_8_;
          SaveErrors(errors_00,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe78);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffe78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_108[0] != local_f8) {
            operator_delete(local_108[0],local_f8[0] + 1);
          }
          goto LAB_0068c04b;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffe90,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffea8);
        errors_01.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe78;
        errors_01.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe68._0_8_;
        errors_01.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe68._8_8_;
        SaveErrors(errors_01,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xfffffffffffffe90);
LAB_0068c04b:
        bVar2 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffea8);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_138);
      std::filesystem::__cxx11::path::~path(&local_78);
      std::filesystem::__cxx11::path::~path(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return bVar2;
      }
      goto LAB_0068c229;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"Attempt to write settings file when dynamic settings are disabled.");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
LAB_0068c229:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::WriteSettingsFile(std::vector<std::string>* errors, bool backup) const
{
    fs::path path, path_tmp;
    if (!GetSettingsPath(&path, /*temp=*/false, backup) || !GetSettingsPath(&path_tmp, /*temp=*/true, backup)) {
        throw std::logic_error("Attempt to write settings file when dynamic settings are disabled.");
    }

    LOCK(cs_args);
    std::vector<std::string> write_errors;
    if (!common::WriteSettings(path_tmp, m_settings.rw_settings, write_errors)) {
        SaveErrors(write_errors, errors);
        return false;
    }
    if (!RenameOver(path_tmp, path)) {
        SaveErrors({strprintf("Failed renaming settings file %s to %s\n", fs::PathToString(path_tmp), fs::PathToString(path))}, errors);
        return false;
    }
    return true;
}